

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O1

Ivy_Obj_t * Ivy_Miter(Ivy_Man_t *p,Vec_Ptr_t *vPairs)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  long lVar3;
  
  if (vPairs->nSize < 1) {
    __assert_fail("vPairs->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyOper.c"
                  ,0x10b,"Ivy_Obj_t *Ivy_Miter(Ivy_Man_t *, Vec_Ptr_t *)");
  }
  if ((vPairs->nSize & 1U) == 0) {
    iVar1 = vPairs->nSize;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        pIVar2 = Ivy_Exor(p,(Ivy_Obj_t *)vPairs->pArray[lVar3],
                          (Ivy_Obj_t *)vPairs->pArray[lVar3 + 1]);
        *(ulong *)((long)vPairs->pArray + lVar3 * 4) = (ulong)pIVar2 ^ 1;
        lVar3 = lVar3 + 2;
        iVar1 = vPairs->nSize;
      } while ((int)lVar3 < iVar1);
    }
    vPairs->nSize = iVar1 / 2;
    pIVar2 = Ivy_Multi_rec(p,(Ivy_Obj_t **)vPairs->pArray,iVar1 / 2,IVY_AND);
    return (Ivy_Obj_t *)((ulong)pIVar2 ^ 1);
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyOper.c"
                ,0x10c,"Ivy_Obj_t *Ivy_Miter(Ivy_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Ivy_Obj_t * Ivy_Miter( Ivy_Man_t * p, Vec_Ptr_t * vPairs )
{
    int i;
    assert( vPairs->nSize > 0 );
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    for ( i = 0; i < vPairs->nSize; i += 2 )
        vPairs->pArray[i/2] = Ivy_Not( Ivy_Exor( p, (Ivy_Obj_t *)vPairs->pArray[i], (Ivy_Obj_t *)vPairs->pArray[i+1] ) );
    vPairs->nSize = vPairs->nSize/2;
    return Ivy_Not( Ivy_Multi_rec( p, (Ivy_Obj_t **)vPairs->pArray, vPairs->nSize, IVY_AND ) );
}